

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O1

int Abc_NtkQuantify(Abc_Ntk_t *pNtk,int fUniv,int iVar,int fVerbose)

{
  void **ppvVar1;
  int *piVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  ulong uVar7;
  Abc_Obj_t *p0;
  long lVar8;
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_38;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcQuant.c"
                  ,0x58,"int Abc_NtkQuantify(Abc_Ntk_t *, int, int, int)");
  }
  if (pNtk->vCis->nSize <= iVar) {
    __assert_fail("iVar < Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcQuant.c"
                  ,0x59,"int Abc_NtkQuantify(Abc_Ntk_t *, int, int, int)");
  }
  if (iVar < 0) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  local_38 = (Abc_Obj_t *)pNtk->vCis->pArray[(uint)iVar];
  pVVar4 = Abc_NtkDfsReverseNodes(pNtk,&local_38,1);
  pAVar5 = Abc_AigConst1(pNtk);
  (local_38->field_6).pTemp = (void *)((ulong)pAVar5 ^ 1);
  pAVar5 = Abc_AigConst1(pNtk);
  (local_38->field_5).pData = pAVar5;
  if (0 < pVVar4->nSize) {
    lVar8 = 0;
    do {
      local_38 = (Abc_Obj_t *)pVVar4->pArray[lVar8];
      if (local_38 == (Abc_Obj_t *)0x0) goto LAB_002f2aad;
      pAVar5 = (local_38->field_6).pCopy;
      while (local_38 != (Abc_Obj_t *)0x0) {
        pAVar6 = (Abc_Obj_t *)local_38->pNtk->vObjs->pArray[*(local_38->vFanins).pArray];
        iVar3 = Abc_NodeIsTravIdCurrent(pAVar6);
        if (iVar3 == 0) {
          (pAVar6->field_6).pCopy = pAVar6;
          (pAVar6->field_5).pData = pAVar6;
        }
        pAVar6 = (Abc_Obj_t *)local_38->pNtk->vObjs->pArray[(local_38->vFanins).pArray[1]];
        iVar3 = Abc_NodeIsTravIdCurrent(pAVar6);
        if (iVar3 == 0) {
          (pAVar6->field_6).pCopy = pAVar6;
          (pAVar6->field_5).pData = pAVar6;
        }
        ppvVar1 = local_38->pNtk->vObjs->pArray;
        piVar2 = (local_38->vFanins).pArray;
        pAVar6 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)&local_38->field_0x14 >> 10 & 1) ^
                            *(ulong *)((long)ppvVar1[*piVar2] + 0x40)),
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)&local_38->field_0x14 >> 0xb & 1) ^
                            *(ulong *)((long)ppvVar1[piVar2[1]] + 0x40)));
        (local_38->field_6).pCopy = pAVar6;
        ppvVar1 = local_38->pNtk->vObjs->pArray;
        piVar2 = (local_38->vFanins).pArray;
        pAVar6 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)&local_38->field_0x14 >> 10 & 1) ^
                            *(ulong *)((long)ppvVar1[*piVar2] + 0x38)),
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)&local_38->field_0x14 >> 0xb & 1) ^
                            *(ulong *)((long)ppvVar1[piVar2[1]] + 0x38)));
        (local_38->field_5).pData = pAVar6;
        local_38 = pAVar5;
        if (pAVar5 == (Abc_Obj_t *)0x0) {
LAB_002f2aad:
          pAVar5 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar5 = (pAVar5->field_6).pCopy;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar4->nSize);
  }
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = pNtk->vCos;
  if (0 < pVVar4->nSize) {
    lVar8 = 0;
    do {
      local_38 = (Abc_Obj_t *)pVVar4->pArray[lVar8];
      iVar3 = Abc_NodeIsTravIdCurrent(local_38);
      if (iVar3 != 0) {
        pAVar5 = (Abc_Obj_t *)local_38->pNtk->vObjs->pArray[*(local_38->vFanins).pArray];
        uVar7 = (ulong)(*(uint *)&local_38->field_0x14 >> 10 & 1);
        p0 = (Abc_Obj_t *)((ulong)(pAVar5->field_6).pTemp ^ uVar7);
        pAVar6 = (Abc_Obj_t *)(uVar7 ^ (ulong)(pAVar5->field_5).pData);
        if (fUniv == 0) {
          pAVar6 = Abc_AigOr((Abc_Aig_t *)pNtk->pManFunc,p0,pAVar6);
        }
        else {
          pAVar6 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,p0,pAVar6);
        }
        if (pAVar5 != (Abc_Obj_t *)((ulong)pAVar6 & 0xfffffffffffffffe)) {
          Abc_ObjPatchFanin(local_38,pAVar5,
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)&local_38->field_0x14 >> 10 & 1) ^ (ulong)pAVar6));
        }
      }
      lVar8 = lVar8 + 1;
      pVVar4 = pNtk->vCos;
    } while (lVar8 < pVVar4->nSize);
  }
  return 1;
}

Assistant:

int Abc_NtkQuantify( Abc_Ntk_t * pNtk, int fUniv, int iVar, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pNext, * pFanin;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( iVar < Abc_NtkCiNum(pNtk) );

    // collect the internal nodes
    pObj = Abc_NtkCi( pNtk, iVar );
    vNodes = Abc_NtkDfsReverseNodes( pNtk, &pObj, 1 );

    // assign the cofactors of the CI node to be constants
    pObj->pCopy = Abc_ObjNot( Abc_AigConst1(pNtk) ); 
    pObj->pData = Abc_AigConst1(pNtk); 

    // quantify the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        for ( pNext = pObj? pObj->pCopy : pObj; pObj; pObj = pNext, pNext = pObj? pObj->pCopy : pObj )
        {
            pFanin = Abc_ObjFanin0(pObj);
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
            {
                pFanin->pCopy = pFanin;
                pFanin->pData = pFanin;
            }
            pFanin = Abc_ObjFanin1(pObj);
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
            {
                pFanin->pCopy = pFanin;
                pFanin->pData = pFanin;
            }
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjChild0Data(pObj), Abc_ObjChild1Data(pObj) );
        }
    }
    Vec_PtrFree( vNodes );

    // update the affected COs
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        pFanin = Abc_ObjFanin0(pObj);
        // get the result of quantification
        if ( fUniv )
            pNext = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild0Data(pObj) );
        else
            pNext = Abc_AigOr( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild0Data(pObj) );
        pNext = Abc_ObjNotCond( pNext, Abc_ObjFaninC0(pObj) );
        if ( Abc_ObjRegular(pNext) == pFanin )
            continue;
        // update the fanins of the CO
        Abc_ObjPatchFanin( pObj, pFanin, pNext );
//        if ( Abc_ObjFanoutNum(pFanin) == 0 )
//            Abc_AigDeleteNode( pNtk->pManFunc, pFanin );
    }

    // make sure the node has no fanouts
//    pObj = Abc_NtkCi( pNtk, iVar );
//    assert( Abc_ObjFanoutNum(pObj) == 0 );
    return 1;
}